

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

bool __thiscall ON_CheckSum::SetFileCheckSum(ON_CheckSum *this,wchar_t *filename)

{
  FILE *fp_00;
  FILE *fp;
  bool rc;
  wchar_t *filename_local;
  ON_CheckSum *this_local;
  
  fp._7_1_ = false;
  Zero(this);
  if ((filename == (wchar_t *)0x0) || (*filename == L'\0')) {
    fp._7_1_ = true;
  }
  else {
    fp_00 = ON::OpenFile(filename,L"rb");
    if (fp_00 != (FILE *)0x0) {
      fp._7_1_ = SetFileCheckSum(this,fp_00);
      ON::CloseFile(fp_00);
    }
  }
  return fp._7_1_;
}

Assistant:

bool ON_CheckSum::SetFileCheckSum( const wchar_t* filename )
{
  bool rc = false;
  Zero();
  if ( 0 == filename || 0 == filename[0] )
  {
    rc = true;
  }
  else
  {
    FILE* fp = ON::OpenFile(filename,L"rb");
    if ( fp )
    {
      rc = SetFileCheckSum(fp);
      ON::CloseFile(fp);
    }
  }
  return rc;
}